

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O3

void __thiscall
calculator::ExpressionParser<__int128>::expect(ExpressionParser<__int128> *this,string *str)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((ulong)this,this->index_,(string *)str->_M_string_length);
  if (iVar1 != 0) {
    unexpected(this);
  }
  this->index_ = this->index_ + str->_M_string_length;
  return;
}

Assistant:

void expect(const std::string& str)
  {
    if (expr_.compare(index_, str.size(), str) != 0)
      unexpected();
    index_ += str.size();
  }